

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gzip.c
# Opt level: O0

char * get_suffix(char *path,char *suffix)

{
  int iVar1;
  size_t sVar2;
  size_t sVar3;
  char *in_RSI;
  char *in_RDI;
  char *p;
  size_t suffix_len;
  size_t path_len;
  char *local_8;
  
  sVar2 = strlen(in_RDI);
  sVar3 = strlen(in_RSI);
  if (sVar3 < sVar2) {
    local_8 = in_RDI + (sVar2 - sVar3);
    iVar1 = strcmp(local_8,in_RSI);
    if (iVar1 != 0) {
      local_8 = (char *)0x0;
    }
  }
  else {
    local_8 = (char *)0x0;
  }
  return local_8;
}

Assistant:

static const tchar *
get_suffix(const tchar *path, const tchar *suffix)
{
	size_t path_len = tstrlen(path);
	size_t suffix_len = tstrlen(suffix);
	const tchar *p;

	if (path_len <= suffix_len)
		return NULL;
	p = &path[path_len - suffix_len];
	if (tstrxcmp(p, suffix) == 0)
		return p;
	return NULL;
}